

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_1::BaseRenderingCase::BaseRenderingCase
          (BaseRenderingCase *this,Context *context,char *name,char *desc,RenderTarget target,
          int numSamples,int renderSize)

{
  RenderTarget *pRVar1;
  int local_38;
  int iStack_34;
  int iStack_30;
  int iStack_2c;
  TextureFormat local_28;
  
  TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseRenderingCase_00c0ada0;
  this->m_renderSize = renderSize;
  this->m_numSamples = -1;
  this->m_subpixelBits = -1;
  this->m_flatshade = false;
  this->m_numRequestedSamples = numSamples;
  this->m_renderTarget = target;
  this->m_fboInternalFormat = 0x8058;
  if (target == RENDERTARGET_DEFAULT) {
    pRVar1 = Context::getRenderTarget((this->super_TestCase).m_context);
    local_38 = (pRVar1->m_pixelFormat).redBits;
    iStack_34 = (pRVar1->m_pixelFormat).greenBits;
    iStack_30 = (pRVar1->m_pixelFormat).blueBits;
    iStack_2c = (pRVar1->m_pixelFormat).alphaBits;
  }
  else {
    local_28 = glu::mapGLInternalFormat(0x8058);
    tcu::getTextureFormatBitDepth((tcu *)&local_38,&local_28);
  }
  (this->m_pixelFormat).redBits = local_38;
  (this->m_pixelFormat).greenBits = iStack_34;
  (this->m_pixelFormat).blueBits = iStack_30;
  (this->m_pixelFormat).alphaBits = iStack_2c;
  this->m_texture = 0;
  this->m_rbo = 0;
  this->m_blitDstFbo = 0;
  this->m_blitDstRbo = 0;
  this->m_shader = (ShaderProgram *)0x0;
  this->m_fbo = 0;
  this->m_texture = 0;
  return;
}

Assistant:

BaseRenderingCase::BaseRenderingCase (Context& context, const char* name, const char* desc, RenderTarget target, int numSamples, int renderSize)
	: TestCase				(context, name, desc)
	, m_renderSize			(renderSize)
	, m_numSamples			(-1)
	, m_subpixelBits		(-1)
	, m_flatshade			(false)
	, m_numRequestedSamples	(numSamples)
	, m_renderTarget		(target)
	, m_fboInternalFormat	(GL_RGBA8)
	, m_pixelFormat			((m_renderTarget == RENDERTARGET_DEFAULT) ? (m_context.getRenderTarget().getPixelFormat()) : (getInternalFormatPixelFormat(m_fboInternalFormat)))
	, m_shader				(DE_NULL)
	, m_fbo					(0)
	, m_texture				(0)
	, m_rbo					(0)
	, m_blitDstFbo			(0)
	, m_blitDstRbo			(0)
{
	DE_ASSERT(m_renderTarget < RENDERTARGET_LAST);
	DE_ASSERT((m_numRequestedSamples == -1) == (m_renderTarget != RENDERTARGET_RBO_MULTISAMPLE));
}